

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rule.cpp
# Opt level: O1

void __thiscall Rule::Rule(Rule *this,string *line)

{
  string *psVar1;
  string *psVar2;
  RX *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  undefined4 *puVar9;
  size_type *psVar10;
  _Alloc_hider _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string color_name;
  string rest;
  string pattern;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words_1;
  Nibbler n;
  string local_1f0;
  string local_1d0;
  Color *local_1b0;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  string *local_130;
  RX *local_128;
  Nibbler local_120;
  string *local_e8;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_88 [5];
  
  this->_vptr_Rule = (_func_int **)&PTR__Rule_00113d78;
  local_138 = &(this->section).field_2;
  (this->section)._M_dataplus._M_p = (pointer)local_138;
  (this->section)._M_string_length = 0;
  (this->section).field_2._M_local_buf[0] = '\0';
  local_1b0 = &this->color;
  local_e8 = &this->section;
  Color::Color(local_1b0);
  psVar1 = &this->context;
  local_140 = &(this->context).field_2;
  (this->context)._M_dataplus._M_p = (pointer)local_140;
  (this->context)._M_string_length = 0;
  (this->context).field_2._M_local_buf[0] = '\0';
  RX::RX(&this->rx);
  local_130 = (string *)&this->fragment;
  local_148 = &(this->fragment).field_2;
  (this->fragment)._M_dataplus._M_p = (pointer)local_148;
  (this->fragment)._M_string_length = 0;
  (this->fragment).field_2._M_local_buf[0] = '\0';
  local_128 = &this->rx;
  std::__cxx11::string::_M_replace((ulong)local_130,0,(char *)0x0,0x10f267);
  Nibbler::Nibbler(&local_120,line);
  Nibbler::skipWS(&local_120);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  bVar3 = Nibbler::getUntilWS(&local_120,&this->section);
  if (bVar3) {
    bVar3 = Nibbler::skipWS(&local_120);
    if (!bVar3) goto LAB_0010a665;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"rule","");
    bVar4 = Nibbler::getLiteral(&local_120,&local_c0);
    bVar5 = true;
    bVar3 = true;
    if (!bVar4) goto LAB_0010a667;
    bVar3 = Nibbler::skipWS(&local_120);
  }
  else {
LAB_0010a665:
    bVar3 = false;
LAB_0010a667:
    bVar5 = bVar3;
    bVar3 = false;
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) goto LAB_0010ac49;
  bVar3 = Nibbler::getQuoted(&local_120,'/',&local_1a8,false);
  if (bVar3) {
    bVar3 = Nibbler::skipWS(&local_120);
    if (!bVar3) goto LAB_0010a707;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"-->","");
    bVar5 = Nibbler::getLiteral(&local_120,&local_e0);
    bVar3 = true;
  }
  else {
LAB_0010a707:
    bVar3 = false;
    bVar5 = false;
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5 != false) {
    Nibbler::skipWS(&local_120);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    Nibbler::getRemainder(&local_120,&local_1d0);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_188.field_2._M_allocated_capacity = 0;
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_188,&local_1d0,' ');
    if (local_188._M_dataplus._M_p != (pointer)local_188._M_string_length) {
      _Var11._M_p = local_188._M_dataplus._M_p;
      do {
        if (*(ulong *)((long)_Var11._M_p + 8) != 0) {
          iVar6 = std::__cxx11::string::compare(_Var11._M_p);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare(_Var11._M_p);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare(_Var11._M_p);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare(_Var11._M_p);
                if (iVar6 != 0) {
                  if (local_1f0._M_string_length != 0) {
                    std::__cxx11::string::append((char *)&local_1f0);
                  }
                  std::__cxx11::string::_M_append((char *)&local_1f0,*(ulong *)_Var11._M_p);
                  goto LAB_0010a840;
                }
              }
            }
          }
          std::__cxx11::string::_M_assign((string *)psVar1);
        }
LAB_0010a840:
        _Var11._M_p = _Var11._M_p + 0x20;
      } while (_Var11._M_p != (pointer)local_188._M_string_length);
    }
    Color::Color((Color *)local_a0,&local_1f0);
    this_00 = local_128;
    Color::operator=(local_1b0,(Color *)local_a0);
    Color::~Color((Color *)local_a0);
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      lVar7 = std::__cxx11::string::find((char)&local_1a8,0x28);
      if (lVar7 == -1) {
        std::operator+(&local_168,"(",&local_1a8);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_168);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar10) {
          local_a0._16_8_ = *psVar10;
          aaStack_88[0]._0_8_ = plVar8[3];
          local_a0._0_8_ = local_a0 + 0x10;
        }
        else {
          local_a0._16_8_ = *psVar10;
          local_a0._0_8_ = (size_type *)*plVar8;
        }
        local_a0._8_8_ = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_a0);
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
    }
    RX::RX((RX *)local_a0,&local_1a8,true);
    RX::operator=(this_00,(RX *)local_a0);
    RX::~RX((RX *)local_a0);
    this_01 = &local_188;
    goto LAB_0010abd1;
  }
  bVar3 = Nibbler::getQuoted(&local_120,'\"',&local_1a8,false);
  if (bVar3) {
    bVar3 = Nibbler::skipWS(&local_120);
    if (!bVar3) goto LAB_0010a98e;
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-->","");
    bVar5 = Nibbler::getLiteral(&local_120,(string *)local_a0);
    bVar3 = true;
  }
  else {
LAB_0010a98e:
    bVar3 = false;
    bVar5 = false;
  }
  if ((bVar3) && ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if (bVar5 == false) {
LAB_0010ac49:
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 1;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  Nibbler::skipWS(&local_120);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  Nibbler::getRemainder(&local_120,&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_168.field_2._M_allocated_capacity = 0;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_168,&local_1d0,' ');
  if (local_168._M_dataplus._M_p != (pointer)local_168._M_string_length) {
    _Var11._M_p = local_168._M_dataplus._M_p;
    do {
      if (*(ulong *)((long)_Var11._M_p + 8) != 0) {
        iVar6 = std::__cxx11::string::compare(_Var11._M_p);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare(_Var11._M_p);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare(_Var11._M_p);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare(_Var11._M_p);
              if (iVar6 != 0) {
                if (local_1f0._M_string_length != 0) {
                  std::__cxx11::string::append((char *)&local_1f0);
                }
                std::__cxx11::string::_M_append((char *)&local_1f0,*(ulong *)_Var11._M_p);
                goto LAB_0010aad0;
              }
            }
          }
        }
        std::__cxx11::string::_M_assign((string *)psVar1);
      }
LAB_0010aad0:
      _Var11._M_p = _Var11._M_p + 0x20;
    } while (_Var11._M_p != (pointer)local_168._M_string_length);
  }
  Color::Color((Color *)&local_188,&local_1f0);
  psVar2 = local_130;
  Color::operator=(local_1b0,(Color *)&local_188);
  Color::~Color((Color *)&local_188);
  std::__cxx11::string::_M_assign(psVar2);
  this_01 = &local_168;
LAB_0010abd1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  Nibbler::~Nibbler(&local_120);
  return;
}

Assistant:

Rule::Rule (const std::string& line)
{
  fragment = "";

  Nibbler n (line);
  n.skipWS ();

  std::string pattern;
  if (n.getUntilWS (section)     &&
      n.skipWS ()                &&
      n.getLiteral ("rule")      &&
      n.skipWS ())
  {
    // <section> rule /<pattern>/
    if (n.getQuoted ('/', pattern) &&
        n.skipWS ()                &&
        n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);

      // Now for "match" context patterns, add an enclosing ( ... ) is not
      // already present.
      if (context == "match")
        if (pattern.find ('(') == std::string::npos)
          pattern = "(" + pattern + ")";

      rx = RX (pattern, true);
      return;
    }

    // <section> rule "<pattern>"
    else if (n.getQuoted ('"', pattern) &&
             n.skipWS ()                &&
             n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          // TODO Support context "datetime", "time"
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);
      fragment = pattern;
      return;
    }
  }

  // Indicates that 'line' was not a rule def, but a blank line or similar.
  throw int (1);
}